

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O3

int dasm_encode(BuildCtx *ctx,void *buffer)

{
  uint uVar1;
  dasm_State *pdVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  byte bVar7;
  uint *puVar8;
  byte *pbVar9;
  uint *puVar10;
  long lVar11;
  char cVar12;
  uint uVar13;
  ulong __n;
  uint *puVar14;
  uint *puVar15;
  byte bVar16;
  byte *pbVar17;
  uint *puVar18;
  byte *pbVar19;
  int iVar20;
  uint *__s;
  
  pdVar2 = ctx->D;
  iVar4 = pdVar2->maxsection;
  __s = (uint *)buffer;
  if (iVar4 < 1) {
LAB_00106730:
    return (uint)((uint *)((long)buffer + pdVar2->codesize) != __s) << 0x19;
  }
  lVar11 = 0;
LAB_0010625c:
  puVar10 = (uint *)pdVar2->sections[lVar11].buf;
  puVar8 = (uint *)(pdVar2->sections[lVar11].rbuf + pdVar2->sections[lVar11].pos);
  if (puVar10 != puVar8) {
LAB_00106285:
    puVar14 = (uint *)0x0;
    pbVar17 = pdVar2->actionlist + (int)*puVar10;
    puVar10 = puVar10 + 1;
switchD_001062d4_caseD_fd:
    pbVar9 = pbVar17;
    puVar15 = puVar14;
    bVar7 = *pbVar9;
    __n = 0;
    if ((byte)(bVar7 + 0x17) < 0x12) {
      __n = (ulong)*puVar10;
      puVar10 = puVar10 + 1;
    }
    uVar13 = (uint)__n;
    pbVar19 = pbVar9 + 1;
    if (bVar7 - 0xe9 < 0x17) goto code_r0x001062c7;
    goto LAB_001065bc;
  }
  goto LAB_0010671c;
code_r0x001062c7:
  cVar12 = (char)__n;
  iVar4 = (int)buffer;
  iVar20 = (int)__s;
  puVar14 = __s;
  pbVar17 = pbVar19;
  puVar18 = puVar10;
  switch((uint)bVar7) {
  case 0xe9:
    puVar14 = puVar15;
    if (puVar15 == (uint *)0x0) {
      puVar14 = __s;
    }
    puVar15 = (uint *)0x0;
    if ((*pbVar19 & 0xfe) == 0xee) {
      puVar15 = puVar14;
    }
    if (uVar13 == 0) {
      bVar7 = *(byte *)((long)puVar14 + -1);
      bVar16 = bVar7 & 7;
      if (bVar16 == 4) {
        bVar16 = (byte)*puVar14 & 7;
      }
      if (bVar16 != 5) {
        *(byte *)((long)puVar14 + -1) = bVar7 + 0x80;
        puVar14 = puVar15;
        goto switchD_001062d4_caseD_fd;
      }
    }
    else {
      if ((int)cVar12 != uVar13) break;
      bVar7 = *(byte *)((long)puVar14 + -1);
    }
    *(byte *)((long)puVar14 + -1) = bVar7 - 0x40;
    goto LAB_001066a4;
  default:
    goto LAB_001066a4;
  case 0xec:
    goto switchD_001062d4_caseD_ec;
  case 0xed:
    break;
  case 0xee:
    if ((int)cVar12 == uVar13) {
LAB_0010659f:
      if (puVar15 == (uint *)0x0) {
        puVar15 = __s;
      }
      *(byte *)((long)puVar15 + -2) = *(byte *)((long)puVar15 + -2) + 2;
      puVar15 = (uint *)0x0;
      goto LAB_001066a4;
    }
    puVar15 = (uint *)0x0;
    goto switchD_001062d4_caseD_ec;
  case 0xef:
    if ((int)cVar12 == uVar13) goto LAB_0010659f;
    puVar15 = (uint *)0x0;
    break;
  case 0xf0:
    bVar7 = pbVar9[1];
    pbVar17 = (byte *)((long)__s - (ulong)(bVar7 & 7));
    if (((__n & 8) == 0) || (0x9f < bVar7)) {
      if ((__n & 0x10) != 0) {
        if ((char)*pbVar17 < '\0') {
          *pbVar17 = 0xc5;
          pbVar17[1] = pbVar17[1] & 0x80 | pbVar17[2];
          pbVar17 = pbVar17 + 2;
        }
        if (pbVar17 + 1 < __s) {
          memmove(pbVar17,pbVar17 + 1,(size_t)(~(ulong)pbVar17 + (long)__s));
        }
        if (puVar15 != (uint *)0x0) {
          puVar15 = (uint *)((long)puVar15 + -1);
        }
        __s = (uint *)((long)__s + -1);
        __n = (ulong)(uVar13 & 7);
      }
      if (bVar7 < 0xc0) goto LAB_001066c1;
      __n = (ulong)(uint)((int)__n << 4);
    }
    else {
      if ((char)*pbVar17 < '\0') {
        pbVar17[1] = pbVar17[1] ^ ' ' << (bVar7 >> 6);
      }
      else {
        *pbVar17 = *pbVar17 ^ '\x01' << (bVar7 >> 6);
      }
      __n = (ulong)(uVar13 & 7);
LAB_001066c1:
      if (bVar7 < 0x40) {
        if (((int)__n == 4) && (bVar7 < 0x20)) {
          *(byte *)((long)__s + -1) = *(byte *)((long)__s + -1) ^ 4;
          *(byte *)__s = 0x20;
          __s = (uint *)((long)__s + 1);
          __n = 4;
        }
      }
      else {
        __n = (ulong)(uint)((int)__n << 3);
      }
    }
    *(byte *)((long)__s + -1) = *(byte *)((long)__s + -1) ^ (byte)__n;
    goto LAB_001066f0;
  case 0xf1:
    puVar14 = puVar15;
    pbVar17 = pbVar9 + 2;
    if (uVar13 == 0) goto switchD_001062d4_caseD_fd;
    memset(__s,(uint)*pbVar19,__n);
    __s = (uint *)((long)__s + (ulong)(uVar13 - 1) + 1);
    goto LAB_001066f0;
  case 0xf2:
  case 0xf9:
    goto switchD_001062d4_caseD_f2;
  case 0xf3:
    goto LAB_001065d4;
  case 0xf4:
    pbVar19 = pbVar9 + 2;
    if (-1 < (int)uVar13) goto LAB_00106442;
    puVar10 = puVar10 + 1;
    uVar13 = *(uint *)(pdVar2->globals + -uVar13);
LAB_001065d4:
    uVar13 = (uVar13 - iVar20) - 4;
    break;
  case 0xf5:
LAB_00106442:
    puVar18 = puVar10 + 1;
    piVar3 = pdVar2->sections[(int)uVar13 >> 0x18].rbuf;
    iVar5 = piVar3[(int)uVar13];
    if (iVar5 < 0) {
      uVar13 = piVar3[(long)(int)uVar13 + 1];
      puVar10 = puVar18;
      goto LAB_001065d4;
    }
    uVar1 = *puVar10;
    uVar13 = (uVar1 + (iVar4 - iVar20) + iVar5) - 4;
    __n = (ulong)uVar13;
    puVar10 = puVar18;
    if (uVar1 != 0) {
      if (uVar1 == 4) {
        *(byte *)((long)__s + -2) = *(byte *)((long)__s + -1) - 0x10;
        __s = (uint *)((long)__s + -1);
      }
      else {
        *(byte *)((long)__s + -1) = 0xeb;
      }
LAB_001066a4:
      *(byte *)__s = (byte)__n;
      __s = (uint *)((long)__s + 1);
      puVar14 = puVar15;
      pbVar17 = pbVar19;
      puVar10 = puVar18;
      goto switchD_001062d4_caseD_fd;
    }
    break;
  case 0xf6:
    pbVar19 = pbVar9 + 2;
    if (-1 < (int)uVar13) goto switchD_001062d4_caseD_f7;
    uVar13 = *(uint *)(pdVar2->globals + -uVar13);
    break;
  case 0xf7:
switchD_001062d4_caseD_f7:
    piVar3 = pdVar2->sections[(int)uVar13 >> 0x18].rbuf;
    iVar20 = piVar3[(int)uVar13];
    if (iVar20 < 0) {
      uVar13 = piVar3[(long)(int)uVar13 + 1];
    }
    else {
      uVar13 = iVar20 + iVar4;
    }
    break;
  case 0xf8:
    puVar14 = puVar15;
    pbVar17 = pbVar9 + 2;
    if ((ulong)pbVar9[1] < 10) goto switchD_001062d4_caseD_fd;
    if (pbVar9[2] == 0xf2) {
      uVar13 = *puVar10;
    }
    pdVar2->globals[pbVar9[1]] = (void *)((long)(int)uVar13 + (long)buffer);
    goto LAB_001066f0;
  case 0xfa:
    bVar7 = pbVar9[1];
    puVar14 = puVar15;
    pbVar17 = pbVar9 + 2;
    if ((iVar20 - iVar4 & (uint)bVar7) == 0) goto switchD_001062d4_caseD_fd;
    pbVar17 = (byte *)((1 - (long)buffer) + (long)__s);
    do {
      *(byte *)__s = 0x90;
      __s = (uint *)((long)__s + 1);
      uVar13 = (uint)pbVar17;
      pbVar17 = pbVar17 + 1;
    } while ((uVar13 & bVar7) != 0);
LAB_001066f0:
    puVar14 = puVar15;
    pbVar17 = pbVar9 + 2;
    goto switchD_001062d4_caseD_fd;
  case 0xfb:
    iVar4 = ctx->nreloc;
    if (199 < iVar4) {
      dasm_encode_cold_1();
    }
    bVar7 = *pbVar19;
    bVar16 = pbVar9[2];
    iVar5 = relocmap[bVar16];
    if (iVar5 < 0) {
      relocmap[bVar16] = ctx->nrelocsym;
      pcVar6 = sym_decorate((BuildCtx *)(ulong)ctx->mode,"",extnames[bVar16]);
      iVar4 = ctx->nrelocsym;
      ctx->relocsym[iVar4] = pcVar6;
      ctx->nrelocsym = iVar4 + 1;
      iVar4 = ctx->nreloc;
      iVar5 = relocmap[bVar16];
    }
    ctx->reloc[iVar4].ofs = iVar20 - *(int *)&ctx->code;
    ctx->reloc[iVar4].sym = iVar5;
    ctx->reloc[iVar4].type = (uint)bVar7;
    ctx->nreloc = iVar4 + 1;
    pbVar19 = pbVar9 + 3;
    uVar13 = 0;
    break;
  case 0xfc:
    bVar7 = pbVar9[1];
    pbVar19 = pbVar9 + 2;
LAB_001065bc:
    *(byte *)__s = bVar7;
    __s = (uint *)((long)__s + 1);
    goto switchD_001062d4_caseD_f2;
  case 0xfd:
    goto switchD_001062d4_caseD_fd;
  case 0xfe:
  case 0xff:
    goto switchD_001062d4_caseD_fe;
  }
  *__s = uVar13;
  __s = __s + 1;
switchD_001062d4_caseD_f2:
  puVar14 = puVar15;
  pbVar17 = pbVar19;
  goto switchD_001062d4_caseD_fd;
switchD_001062d4_caseD_fe:
  if (puVar10 == puVar8) goto code_r0x00106714;
  goto LAB_00106285;
code_r0x00106714:
  iVar4 = pdVar2->maxsection;
LAB_0010671c:
  lVar11 = lVar11 + 1;
  if (iVar4 <= lVar11) goto LAB_00106730;
  goto LAB_0010625c;
switchD_001062d4_caseD_ec:
  *(short *)__s = (short)__n;
  __s = (uint *)((long)__s + 2);
  goto switchD_001062d4_caseD_f2;
}

Assistant:

int dasm_encode(Dst_DECL, void *buffer)
{
  dasm_State *D = Dst_REF;
  unsigned char *base = (unsigned char *)buffer;
  unsigned char *cp = base;
  int secnum;

  /* Encode all code sections. No support for data sections (yet). */
  for (secnum = 0; secnum < D->maxsection; secnum++) {
    dasm_Section *sec = D->sections + secnum;
    int *b = sec->buf;
    int *endb = sec->rbuf + sec->pos;

    while (b != endb) {
      dasm_ActList p = D->actionlist + *b++;
      unsigned char *mark = NULL;
      while (1) {
	int action = *p++;
	int n = (action >= DASM_DISP && action <= DASM_ALIGN) ? *b++ : 0;
	switch (action) {
	case DASM_DISP: if (!mark) mark = cp; {
	  unsigned char *mm = mark;
	  if (*p != DASM_IMM_DB && *p != DASM_IMM_WB) mark = NULL;
	  if (n == 0) { int mrm = mm[-1]&7; if (mrm == 4) mrm = mm[0]&7;
	    if (mrm != 5) { mm[-1] -= 0x80; break; } }
	  if (((n+128) & -256) != 0) goto wd; else mm[-1] -= 0x40;
	}
	  /* fallthrough */
	case DASM_IMM_S: case DASM_IMM_B: wb: dasmb(n); break;
	case DASM_IMM_DB: if (((n+128)&-256) == 0) {
	    db: if (!mark) mark = cp; mark[-2] += 2; mark = NULL; goto wb;
	  } else mark = NULL;
	  /* fallthrough */
	case DASM_IMM_D: wd: dasmd(n); break;
	case DASM_IMM_WB: if (((n+128)&-256) == 0) goto db; else mark = NULL;
	  /* fallthrough */
	case DASM_IMM_W: dasmw(n); break;
	case DASM_VREG: {
	  int t = *p++;
	  unsigned char *ex = cp - (t&7);
	  if ((n & 8) && t < 0xa0) {
	    if (*ex & 0x80) ex[1] ^= 0x20 << (t>>6); else *ex ^= 1 << (t>>6);
	    n &= 7;
	  } else if (n & 0x10) {
	    if (*ex & 0x80) {
	      *ex = 0xc5; ex[1] = (ex[1] & 0x80) | ex[2]; ex += 2;
	    }
	    while (++ex < cp) ex[-1] = *ex;
	    if (mark) mark--;
	    cp--;
	    n &= 7;
	  }
	  if (t >= 0xc0) n <<= 4;
	  else if (t >= 0x40) n <<= 3;
	  else if (n == 4 && t < 0x20) { cp[-1] ^= n; *cp++ = 0x20; }
	  cp[-1] ^= n;
	  break;
	}
	case DASM_REL_LG: p++; if (n >= 0) goto rel_pc;
	  b++; n = (int)(ptrdiff_t)D->globals[-n];
	  /* fallthrough */
	case DASM_REL_A: rel_a: n -= (int)(ptrdiff_t)(cp+4); goto wd; /* !x64 */
	case DASM_REL_PC: rel_pc: {
	  int shrink = *b++;
	  int *pb = DASM_POS2PTR(D, n); if (*pb < 0) { n = pb[1]; goto rel_a; }
	  n = *pb - ((int)(cp-base) + 4-shrink);
	  if (shrink == 0) goto wd;
	  if (shrink == 4) { cp--; cp[-1] = *cp-0x10; } else cp[-1] = 0xeb;
	  goto wb;
	}
	case DASM_IMM_LG:
	  p++; if (n < 0) { n = (int)(ptrdiff_t)D->globals[-n]; goto wd; }
	  /* fallthrough */
	case DASM_IMM_PC: {
	  int *pb = DASM_POS2PTR(D, n);
	  n = *pb < 0 ? pb[1] : (*pb + (int)(ptrdiff_t)base);
	  goto wd;
	}
	case DASM_LABEL_LG: {
	  int idx = *p++;
	  if (idx >= 10)
	    D->globals[idx] = (void *)(base + (*p == DASM_SETLABEL ? *b : n));
	  break;
	}
	case DASM_LABEL_PC: case DASM_SETLABEL: break;
	case DASM_SPACE: { int fill = *p++; while (n--) *cp++ = fill; break; }
	case DASM_ALIGN:
	  n = *p++;
	  while (((cp-base) & n)) *cp++ = 0x90; /* nop */
	  break;
	case DASM_EXTERN: n = DASM_EXTERN(Dst, cp, p[1], *p); p += 2; goto wd;
	case DASM_MARK: mark = cp; break;
	case DASM_ESC: action = *p++;
	  /* fallthrough */
	default: *cp++ = action; break;
	case DASM_SECTION: case DASM_STOP: goto stop;
	}
      }
      stop: (void)0;
    }
  }

  if (base + D->codesize != cp)  /* Check for phase errors. */
    return DASM_S_PHASE;
  return DASM_S_OK;
}